

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

CTypeID argv2ctype(jit_State *J,TRef tr,cTValue *o)

{
  uint uVar1;
  uint uVar2;
  TRef TVar3;
  int iVar4;
  GCcdata *cd_00;
  CTypeID local_f4;
  GCcdata *cd;
  undefined1 local_d0 [4];
  CTypeID oldtop;
  CPState cp;
  GCstr *s;
  cTValue *o_local;
  TRef tr_local;
  jit_State *J_local;
  CTState *cts;
  
  if ((tr & 0x1f000000) == 0x4000000) {
    cp._120_8_ = o->u64 & 0x7fffffffffff;
    TVar3 = lj_ir_kgc(J,(GCobj *)cp._120_8_,IRT_STR);
    (J->fold).ins.field_0.ot = 0x884;
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    lj_opt_fold(J);
    cp.sb.L.ptr64 = (uint64_t)J->L;
    cp.L = *(lua_State **)((J->L->glref).ptr64 + 0x180);
    ((cp.L)->glref).ptr64 = (uint64_t)J->L;
    uVar1._0_1_ = (cp.L)->marked;
    uVar1._1_1_ = (cp.L)->gct;
    uVar1._2_1_ = (cp.L)->dummy_ffid;
    uVar1._3_1_ = (cp.L)->status;
    cp.param = (TValue *)(cp._120_8_ + 0x18);
    cp.ct = (CType *)(cp._120_8_ + 0x18);
    cp.cts = (CTState *)0x0;
    cp.depth = 0x12;
    iVar4 = lj_cparse((CPState *)local_d0);
    if ((iVar4 != 0) ||
       (uVar2._0_1_ = (cp.L)->marked, uVar2._1_1_ = (cp.L)->gct, uVar2._2_1_ = (cp.L)->dummy_ffid,
       uVar2._3_1_ = (cp.L)->status, uVar1 < uVar2)) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    J_local._4_4_ = cp.tok;
  }
  else {
    cd_00 = argv2cdata(J,tr,o);
    if (cd_00->ctypeid == 0x16) {
      local_f4 = crec_constructor(J,cd_00,tr);
    }
    else {
      local_f4 = (CTypeID)cd_00->ctypeid;
    }
    J_local._4_4_ = local_f4;
  }
  return J_local._4_4_;
}

Assistant:

static CTypeID argv2ctype(jit_State *J, TRef tr, cTValue *o)
{
  if (tref_isstr(tr)) {
    GCstr *s = strV(o);
    CPState cp;
    CTypeID oldtop;
    /* Specialize to the string containing the C type declaration. */
    emitir(IRTG(IR_EQ, IRT_STR), tr, lj_ir_kstr(J, s));
    cp.L = J->L;
    cp.cts = ctype_cts(J->L);
    oldtop = cp.cts->top;
    cp.srcname = strdata(s);
    cp.p = strdata(s);
    cp.param = NULL;
    cp.mode = CPARSE_MODE_ABSTRACT|CPARSE_MODE_NOIMPLICIT;
    if (lj_cparse(&cp) || cp.cts->top > oldtop)  /* Avoid new struct defs. */
      lj_trace_err(J, LJ_TRERR_BADTYPE);
    return cp.val.id;
  } else {
    GCcdata *cd = argv2cdata(J, tr, o);
    return cd->ctypeid == CTID_CTYPEID ? crec_constructor(J, cd, tr) :
					cd->ctypeid;
  }
}